

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderAdjacencyTests::setLineStripPointsNonindiced
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  GLfloat *pGVar3;
  uint local_38;
  uint local_34;
  uint n_1;
  uint n;
  float *travellerPtr;
  float *travellerExpectedGeometryPtr;
  float *travellerExpectedAdjacencyGeometryPtr;
  AdjacencyTestData *test_data_local;
  GeometryShaderAdjacencyTests *this_local;
  
  test_data->m_n_vertices = (test_data->m_grid->m_line_strip).m_n_points;
  test_data->m_geometry_bo_size = (test_data->m_n_vertices - 3) * this->m_n_components_output * 8;
  test_data->m_vertex_data_bo_size = test_data->m_n_vertices * this->m_n_components_input * 4;
  auVar1 = ZEXT416(test_data->m_geometry_bo_size >> 2) * ZEXT816(4);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pGVar3 = (GLfloat *)operator_new__(uVar2);
  test_data->m_expected_adjacency_geometry = pGVar3;
  auVar1 = ZEXT416(test_data->m_geometry_bo_size >> 2) * ZEXT816(4);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pGVar3 = (GLfloat *)operator_new__(uVar2);
  test_data->m_expected_geometry = pGVar3;
  auVar1 = ZEXT416(test_data->m_vertex_data_bo_size >> 2) * ZEXT816(4);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pGVar3 = (GLfloat *)operator_new__(uVar2);
  test_data->m_vertex_data = pGVar3;
  travellerExpectedGeometryPtr = test_data->m_expected_adjacency_geometry;
  travellerPtr = test_data->m_expected_geometry;
  _n_1 = test_data->m_vertex_data;
  for (local_34 = 0; local_34 < test_data->m_n_vertices; local_34 = local_34 + 1) {
    *_n_1 = (test_data->m_grid->m_line_strip).m_points[local_34].x;
    _n_1[1] = (test_data->m_grid->m_line_strip).m_points[local_34].y;
    _n_1 = _n_1 + 2;
  }
  for (local_38 = 0; local_38 < test_data->m_n_vertices - 3; local_38 = local_38 + 1) {
    *travellerExpectedGeometryPtr = (test_data->m_grid->m_line_strip).m_points[local_38].x;
    travellerExpectedGeometryPtr[1] = (test_data->m_grid->m_line_strip).m_points[local_38].y;
    travellerExpectedGeometryPtr[2] = 0.0;
    travellerExpectedGeometryPtr[3] = 1.0;
    travellerExpectedGeometryPtr[4] = (test_data->m_grid->m_line_strip).m_points[local_38 + 3].x;
    travellerExpectedGeometryPtr[5] = (test_data->m_grid->m_line_strip).m_points[local_38 + 3].y;
    travellerExpectedGeometryPtr[6] = 0.0;
    travellerExpectedGeometryPtr[7] = 1.0;
    travellerExpectedGeometryPtr = travellerExpectedGeometryPtr + 8;
    *travellerPtr = (test_data->m_grid->m_line_strip).m_points[local_38 + 1].x;
    travellerPtr[1] = (test_data->m_grid->m_line_strip).m_points[local_38 + 1].y;
    travellerPtr[2] = 0.0;
    travellerPtr[3] = 1.0;
    travellerPtr[4] = (test_data->m_grid->m_line_strip).m_points[local_38 + 2].x;
    travellerPtr[5] = (test_data->m_grid->m_line_strip).m_points[local_38 + 2].y;
    travellerPtr[6] = 0.0;
    travellerPtr[7] = 1.0;
    travellerPtr = travellerPtr + 8;
  }
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::setLineStripPointsNonindiced(AdjacencyTestData& test_data)
{
	float* travellerExpectedAdjacencyGeometryPtr = 0;
	float* travellerExpectedGeometryPtr			 = 0;
	float* travellerPtr							 = 0;

	/* Set buffer sizes */
	test_data.m_n_vertices		 = test_data.m_grid->m_line_strip.m_n_points;
	test_data.m_geometry_bo_size = static_cast<glw::GLuint>((test_data.m_n_vertices - 3) * m_n_components_output *
															2 /* start/end */ * sizeof(float));
	test_data.m_vertex_data_bo_size =
		static_cast<glw::GLuint>(test_data.m_n_vertices * m_n_components_input * sizeof(float));

	/* Allocate memory for input and expected data */
	test_data.m_expected_adjacency_geometry = new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_expected_geometry			= new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_vertex_data					= new float[test_data.m_vertex_data_bo_size / sizeof(float)];

	travellerExpectedAdjacencyGeometryPtr = test_data.m_expected_adjacency_geometry;
	travellerExpectedGeometryPtr		  = test_data.m_expected_geometry;
	travellerPtr						  = test_data.m_vertex_data;

	/* Set input and expected values */
	for (unsigned int n = 0; n < test_data.m_n_vertices; ++n)
	{
		*travellerPtr = test_data.m_grid->m_line_strip.m_points[n].x;
		++travellerPtr;
		*travellerPtr = test_data.m_grid->m_line_strip.m_points[n].y;
		++travellerPtr;
	}

	for (unsigned int n = 0; n < test_data.m_n_vertices - 3; ++n)
	{
		*travellerExpectedAdjacencyGeometryPtr = test_data.m_grid->m_line_strip.m_points[n].x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = test_data.m_grid->m_line_strip.m_points[n].y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = test_data.m_grid->m_line_strip.m_points[n + 3].x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = test_data.m_grid->m_line_strip.m_points[n + 3].y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;

		*travellerExpectedGeometryPtr = test_data.m_grid->m_line_strip.m_points[n + 1].x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = test_data.m_grid->m_line_strip.m_points[n + 1].y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = test_data.m_grid->m_line_strip.m_points[n + 2].x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = test_data.m_grid->m_line_strip.m_points[n + 2].y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
	} /* for (all vertices (apart from the three last ones) ) */
}